

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_4tap_sse2(InterpFilterParams *filter_params,int32_t subpel_q4,__m128i *coeffs)

{
  undefined8 uVar1;
  int16_t *piVar2;
  undefined4 *in_RDX;
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m128i coeff;
  int16_t *filter;
  undefined4 uStack_34;
  undefined4 uStack_30;
  
  piVar2 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  uVar1 = *(undefined8 *)(piVar2 + 4);
  uStack_34 = (undefined4)((ulong)*(undefined8 *)piVar2 >> 0x20);
  *in_RDX = uStack_34;
  in_RDX[1] = uStack_34;
  in_RDX[2] = uStack_34;
  in_RDX[3] = uStack_34;
  uStack_30 = (undefined4)uVar1;
  in_RDX[4] = uStack_30;
  in_RDX[5] = uStack_30;
  in_RDX[6] = uStack_30;
  in_RDX[7] = uStack_30;
  return;
}

Assistant:

static inline void prepare_coeffs_4tap_sse2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m128i *const coeffs /* [2] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  const __m128i coeff = _mm_loadu_si128((__m128i *)filter);

  // coeffs 2 3 2 3 2 3 2 3
  coeffs[0] = _mm_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[1] = _mm_shuffle_epi32(coeff, 0xaa);
}